

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O3

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  PointerType pSVar7;
  PointerType pcVar8;
  char *__s;
  size_t sVar9;
  PointerType pBVar10;
  uint uVar11;
  PositionType *this_00;
  string_view sVar12;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string __str;
  string local_70;
  long *local_50;
  uint local_48;
  undefined4 uStack_44;
  long local_40 [2];
  
  sVar12 = cmSystemTools::GetSystemName();
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_SYSTEM_NAME","");
  this_00 = &this->Position;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  cmDefinitions::Set(pcVar8,&local_70,sVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((sVar12._M_len == 7) &&
     (*(int *)((long)sVar12._M_str + 3) == 0x73776f64 && *(int *)sVar12._M_str == 0x646e6957)) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"WIN32","");
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
    sVar12._M_str = "1";
    sVar12._M_len = 1;
    cmDefinitions::Set(pcVar8,&local_70,sVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_WIN32","");
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
    value_03._M_str = "1";
    value_03._M_len = 1;
    cmDefinitions::Set(pcVar8,&local_70,value_03);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UNIX","");
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
    value._M_str = "1";
    value._M_len = 1;
    cmDefinitions::Set(pcVar8,&local_70,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_UNIX","");
    pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
    value_00._M_str = "1";
    value_00._M_len = 1;
    cmDefinitions::Set(pcVar8,&local_70,value_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"LINUX","");
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_01._M_str = "1";
  value_01._M_len = 1;
  cmDefinitions::Set(pcVar8,&local_70,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_LINUX","");
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_02._M_str = "1";
  value_02._M_len = 1;
  cmDefinitions::Set(pcVar8,&local_70,value_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_MAJOR_VERSION","");
  uVar6 = cmVersion::GetMajorVersion();
  cVar5 = '\x01';
  if (9 < uVar6) {
    uVar11 = uVar6;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar11 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00268d72;
      }
      if (uVar11 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00268d72;
      }
      if (uVar11 < 10000) goto LAB_00268d72;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_00268d72:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar6);
  plVar3 = local_50;
  value_04._M_len._4_4_ = uStack_44;
  value_04._M_len._0_4_ = local_48;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_04._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar8,&local_70,value_04);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_MINOR_VERSION","");
  uVar6 = cmVersion::GetMinorVersion();
  cVar5 = '\x01';
  if (9 < uVar6) {
    uVar11 = uVar6;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar11 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00268e68;
      }
      if (uVar11 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00268e68;
      }
      if (uVar11 < 10000) goto LAB_00268e68;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_00268e68:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar6);
  plVar3 = local_50;
  value_05._M_len._4_4_ = uStack_44;
  value_05._M_len._0_4_ = local_48;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_05._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar8,&local_70,value_05);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_PATCH_VERSION","");
  uVar6 = cmVersion::GetPatchVersion();
  cVar5 = '\x01';
  if (9 < uVar6) {
    uVar11 = uVar6;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar11 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00268f58;
      }
      if (uVar11 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00268f58;
      }
      if (uVar11 < 10000) goto LAB_00268f58;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_00268f58:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar6);
  plVar3 = local_50;
  value_06._M_len._4_4_ = uStack_44;
  value_06._M_len._0_4_ = local_48;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_06._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar8,&local_70,value_06);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_TWEAK_VERSION","");
  uVar6 = cmVersion::GetTweakVersion();
  cVar5 = '\x01';
  if (9 < uVar6) {
    uVar11 = uVar6;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar11 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00269048;
      }
      if (uVar11 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00269048;
      }
      if (uVar11 < 10000) goto LAB_00269048;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_00269048:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar6);
  plVar3 = local_50;
  value_07._M_len._4_4_ = uStack_44;
  value_07._M_len._0_4_ = local_48;
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_07._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar8,&local_70,value_07);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_VERSION","");
  __s = cmVersion::GetCMakeVersion();
  sVar9 = strlen(__s);
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_08._M_str = __s;
  value_08._M_len = sVar9;
  cmDefinitions::Set(pcVar8,&local_70,value_08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_FILES_DIRECTORY","");
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar8 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar7->Vars);
  value_09._M_str = "/CMakeFiles";
  value_09._M_len = 0xb;
  cmDefinitions::Set(pcVar8,&local_70,value_09);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      (&pSVar7->BuildSystemDirectory);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"INCLUDE_REGULAR_EXPRESSION","");
  cmPropertyMap::SetProperty(&pBVar10->Properties,&local_70,"^.*$");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  cm::string_view hostSystemName = cmSystemTools::GetSystemName();
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", hostSystemName);
  if (hostSystemName == "Windows") {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  } else {
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  }
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmIsOn(legacy)) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

#if defined(__OpenBSD__)
  this->SetDefinition("BSD", "OpenBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "OpenBSD");
#elif defined(__FreeBSD__)
  this->SetDefinition("BSD", "FreeBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "FreeBSD");
#elif defined(__NetBSD__)
  this->SetDefinition("BSD", "NetBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "NetBSD");
#elif defined(__DragonFly__)
  this->SetDefinition("BSD", "DragonFlyBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "DragonFlyBSD");
#endif

#if defined(__linux__)
  this->SetDefinition("LINUX", "1");
  this->SetDefinition("CMAKE_HOST_LINUX", "1");
#endif

  this->SetDefinition("CMAKE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()));
  this->SetDefinition("CMAKE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()));
  this->SetDefinition("CMAKE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()));
  this->SetDefinition("CMAKE_TWEAK_VERSION",
                      std::to_string(cmVersion::GetTweakVersion()));
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY", "/CMakeFiles");

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}